

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

bool __thiscall ExpressionContext::IsGenericInstance(ExpressionContext *this,FunctionData *function)

{
  TypeBase *pTVar1;
  long lVar2;
  
  if (((function->isGenericInstance == false) && (function->proto == (FunctionData *)0x0)) &&
     ((pTVar1 = function->scope->ownerType, pTVar1 == (TypeBase *)0x0 ||
      ((pTVar1->typeID != 0x18 ||
       (lVar2._0_4_ = pTVar1[2].typeIndex, lVar2._4_4_ = pTVar1[2].alignment, lVar2 == 0)))))) {
    return false;
  }
  return true;
}

Assistant:

bool ExpressionContext::IsGenericInstance(FunctionData *function)
{
	if(function->isGenericInstance)
		return true;

	if(function->proto != NULL)
		return true;

	if(function->scope->ownerType)
	{
		if(TypeClass *typeClass = getType<TypeClass>(function->scope->ownerType))
		{
			if(typeClass->proto)
				return true;
		}
	}

	return false;
}